

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O1

Error __thiscall asmjit::X86RAPass::annotate(X86RAPass *this)

{
  CCFunc *pCVar1;
  CodeBuilder *pCVar2;
  CodeBuilder *emitter;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  uint32_t uVar5;
  CBInst *node;
  CCFunc *pCVar6;
  StringBuilderTmp<256UL> sb;
  StringBuilder local_158;
  char local_138 [264];
  
  pCVar6 = (this->super_RAPass)._func;
  pCVar1 = (CCFunc *)pCVar6->_end;
  pCVar2 = (this->super_RAPass).super_CBPass._cb;
  local_158._data = local_138;
  local_138[0] = '\0';
  uVar4 = 0;
  local_158._length = 0;
  local_158._capacity = 0x100;
  local_158._canFree = 0;
  uVar5 = 1;
  if (pCVar6 != pCVar1 && pCVar6 != (CCFunc *)0x0) {
    do {
      if (((pCVar6->super_CBLabel).super_CBNode._inlineComment == (char *)0x0) &&
         ((pCVar6->super_CBLabel).super_CBNode._type == '\x01')) {
        emitter = (this->super_RAPass).super_CBPass._cb;
        Logging::formatInstruction
                  (&local_158,0,&emitter->super_CodeEmitter,
                   (uint)(emitter->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,
                   (Detail *)&(pCVar6->super_CBLabel)._id,
                   (Operand_ *)(pCVar6->_funcDetail)._callConv._passedOrder[0],
                   (uint)(pCVar6->super_CBLabel).super_CBNode._opCount);
        iVar3 = Zone::dup(&pCVar2->_cbDataZone,(int)local_158._data);
        (pCVar6->super_CBLabel).super_CBNode._inlineComment = (char *)CONCAT44(extraout_var,iVar3);
        if (uVar4 <= (uint)local_158._length) {
          uVar4 = (uint)local_158._length;
        }
        StringBuilder::clear(&local_158);
      }
      pCVar6 = (CCFunc *)(pCVar6->super_CBLabel).super_CBNode._next;
    } while ((pCVar6 != (CCFunc *)0x0) && (pCVar6 != pCVar1));
    uVar5 = uVar4 + 1;
  }
  (this->super_RAPass)._annotationLength = uVar5;
  StringBuilder::~StringBuilder(&local_158);
  return 0;
}

Assistant:

Error X86RAPass::annotate() {
#if !defined(ASMJIT_DISABLE_LOGGING)
  CCFunc* func = getFunc();

  CBNode* node_ = func;
  CBNode* end = func->getEnd();

  Zone& dataZone = cc()->_cbDataZone;
  StringBuilderTmp<256> sb;

  uint32_t maxLen = 0;
  while (node_ && node_ != end) {
    if (!node_->hasInlineComment()) {
      if (node_->getType() == CBNode::kNodeInst) {
        CBInst* node = static_cast<CBInst*>(node_);
        Logging::formatInstruction(
          sb,
          0,
          cc(),
          cc()->getArchType(),
          node->getInstDetail(), node->getOpArray(), node->getOpCount());

        node_->setInlineComment(
          static_cast<char*>(dataZone.dup(sb.getData(), sb.getLength(), true)));
        maxLen = std::max<uint32_t>(maxLen, static_cast<uint32_t>(sb.getLength()));

        sb.clear();
      }
    }

    node_ = node_->getNext();
  }
  _annotationLength = maxLen + 1;
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}